

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void __thiscall Network::applyMiniBatch(Network *this)

{
  Layer *pLVar1;
  Matrix *this_00;
  Matrix *input;
  size_t sVar2;
  
  sVar2 = this->layerCount;
  while (sVar2 = sVar2 - 1, sVar2 != 0) {
    this_00 = Matrix::multiply(this->layers[sVar2]->deltaWeightSum,this->learningRate);
    input = Matrix::multiply(this->layers[sVar2]->previousDeltaWeight,this->momentum);
    Matrix::add(this_00,input);
    ArrayHelper::multiply
              (this->layers[sVar2]->deltaBiasSum,this->learningRate,this->layers[sVar2]->nodeCount);
    ArrayHelper::multiply
              (this->layers[sVar2]->previousDeltaBias,this->momentum,this->layers[sVar2]->nodeCount)
    ;
    pLVar1 = this->layers[sVar2];
    ArrayHelper::add(pLVar1->deltaBiasSum,pLVar1->previousDeltaBias,pLVar1->nodeCount);
    Matrix::moveData(this->layers[sVar2]->previousDeltaWeight,this->layers[sVar2]->deltaWeightSum);
    pLVar1 = this->layers[sVar2];
    ArrayHelper::copy((ArrayHelper *)pLVar1->deltaBiasSum,(EVP_PKEY_CTX *)pLVar1->previousDeltaBias,
                      (EVP_PKEY_CTX *)pLVar1->nodeCount);
    Matrix::subtract(this->layers[sVar2]->weights,this->layers[sVar2]->deltaWeightSum);
    pLVar1 = this->layers[sVar2];
    ArrayHelper::subtract(pLVar1->biases,pLVar1->deltaBiasSum,pLVar1->nodeCount);
    Matrix::zero(this->layers[sVar2]->deltaWeightSum);
    ArrayHelper::zero(this->layers[sVar2]->deltaBiasSum,this->layers[sVar2]->nodeCount);
  }
  this->batchTrained = 0;
  return;
}

Assistant:

void Network::applyMiniBatch() {
		for (size_t i = layerCount - 1; i > 0; i--) {
			/* Mutliply Learning Rate + momentum with Formula
			 * delta = previousDelta * momentum + learningRate * ∇Loss
			 */
			layers[i]->deltaWeightSum
				->multiply(learningRate)
				->add(layers[i]->previousDeltaWeight->multiply(momentum));

			ArrayHelper::multiply(layers[i]->deltaBiasSum, learningRate, layers[i]->nodeCount);
			ArrayHelper::multiply(layers[i]->previousDeltaBias, momentum, layers[i]->nodeCount);
			ArrayHelper::add(layers[i]->deltaBiasSum, layers[i]->previousDeltaBias, layers[i]->nodeCount);

			/* Delete last previous deltas and set the new one (momentum optimization) */
			Matrix::moveData(layers[i]->previousDeltaWeight, layers[i]->deltaWeightSum);
			ArrayHelper::copy(layers[i]->deltaBiasSum, layers[i]->previousDeltaBias, layers[i]->nodeCount);

			/* Adjust calculated batch data for weights and biases */
			layers[i]->weights->subtract(layers[i]->deltaWeightSum);
			ArrayHelper::subtract(layers[i]->biases, layers[i]->deltaBiasSum, layers[i]->nodeCount);

			/* Set calculated batch to zero again*/
			layers[i]->deltaWeightSum->zero();
			ArrayHelper::zero(layers[i]->deltaBiasSum, layers[i]->nodeCount);
		}
		batchTrained = 0;
}